

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<unsigned_int>::sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>
          (DArray<unsigned_int> *this,BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> comp)

{
  uint s1;
  uint uVar1;
  uint *puVar2;
  unsigned_long *puVar3;
  int iVar4;
  Comparison CVar5;
  uint aux;
  unsigned_long s;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  long local_50;
  BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> comp_local;
  
  if (this->_size < 2) {
    return;
  }
  comp_local.super_SymbolComparator._symType = comp.super_SymbolComparator._symType;
  if ((sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
       ::ft == '\0') &&
     (iVar4 = __cxa_guard_acquire(&sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
                                   ::ft), iVar4 != 0)) {
    DArray<unsigned_long>::DArray
              (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft,0x20);
    __cxa_atexit(DArray<unsigned_long>::~DArray,
                 &sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft,
                 &__dso_handle);
    __cxa_guard_release(&sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
                         ::ft);
  }
  s = this->_size - 1;
  DArray<unsigned_long>::ensure
            (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft,s);
  local_50 = 0;
  uVar7 = 0;
LAB_004503e3:
  iVar4 = Random::getInteger(((int)s - (int)uVar7) + 1);
  s1 = this->_array[(long)iVar4 + uVar7];
  uVar6 = s;
  uVar8 = uVar7;
  uVar9 = (long)iVar4 + uVar7;
  while (uVar8 < uVar9) {
    CVar5 = BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>::compare
                      (&comp_local,this->_array[uVar8],s1);
    if ((uint)(CVar5 + GREATER) < 2) {
      uVar8 = uVar8 + 1;
    }
    else if (CVar5 == GREATER) {
      puVar2 = this->_array;
      uVar1 = puVar2[uVar8];
      if (uVar9 == uVar6) {
        puVar2[uVar9] = uVar1;
        uVar6 = uVar9 - 1;
        puVar2[uVar8] = puVar2[uVar9 - 1];
        puVar2[uVar9 - 1] = s1;
        uVar9 = uVar6;
      }
      else {
        puVar2[uVar8] = puVar2[uVar6];
        puVar2[uVar6] = uVar1;
        uVar6 = uVar6 - 1;
      }
    }
  }
  do {
    uVar8 = uVar9 + 1;
    while( true ) {
      puVar3 = sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array;
      if (uVar6 <= uVar9) {
        if (uVar8 < s) {
          sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array
          [local_50] = uVar8;
          puVar3[local_50 + 1] = s;
          local_50 = local_50 + 2;
        }
        s = uVar9 - 1;
        if ((uVar9 == 0) || (s <= uVar7)) {
          if (local_50 == 0) {
            return;
          }
          uVar7 = sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array
                  [local_50 + -2];
          s = sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array
              [local_50 + -1];
          local_50 = local_50 + -2;
        }
        goto LAB_004503e3;
      }
      CVar5 = BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>::compare
                        (&comp_local,s1,this->_array[uVar8]);
      if ((uint)CVar5 < 2) break;
      if (CVar5 == LESS) {
        puVar2 = this->_array;
        uVar1 = puVar2[uVar6];
        puVar2[uVar6] = puVar2[uVar8];
        puVar2[uVar8] = uVar1;
        uVar6 = uVar6 - 1;
      }
    }
    puVar2 = this->_array;
    puVar2[uVar9] = puVar2[uVar8];
    puVar2[uVar8] = s1;
    uVar9 = uVar8;
  } while( true );
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }